

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlAttrSerializeTxtContent(xmlBufferPtr buf,xmlDocPtr doc,xmlAttrPtr attr,xmlChar *string)

{
  xmlBufPtr buf_00;
  
  if (string != (xmlChar *)0x0 && buf != (xmlBufferPtr)0x0) {
    buf_00 = xmlBufFromBuffer(buf);
    if (buf_00 != (xmlBufPtr)0x0) {
      xmlBufAttrSerializeTxtContent(buf_00,doc,attr,string);
      xmlBufBackToBuffer(buf_00);
      return;
    }
  }
  return;
}

Assistant:

void
xmlAttrSerializeTxtContent(xmlBufferPtr buf, xmlDocPtr doc,
                           xmlAttrPtr attr, const xmlChar * string)
{
    xmlBufPtr buffer;

    if ((buf == NULL) || (string == NULL))
        return;
    buffer = xmlBufFromBuffer(buf);
    if (buffer == NULL)
        return;
    xmlBufAttrSerializeTxtContent(buffer, doc, attr, string);
    xmlBufBackToBuffer(buffer);
}